

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  int iVar4;
  Expression *pEVar5;
  Type *lhs;
  Diagnostic *pDVar6;
  undefined4 extraout_var;
  ReplicatedAssignmentPatternExpression *expr;
  ReplicatedAssignmentPatternExpression *pRVar7;
  specific_symbol_iterator<slang::ast::FieldSymbol> extraout_RDX;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  Symbol *extraout_RDX_00;
  byte bVar9;
  ReplicatedAssignmentPatternExpression *ctx;
  long lVar10;
  ulong uVar11;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar12;
  size_t count;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  Compilation *compilation;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_e0;
  ReplicatedAssignmentPatternExpression *local_d0;
  Expression *local_c8;
  Expression *local_c0;
  size_t local_b8;
  undefined1 local_b0 [64];
  SmallVectorBase<const_slang::ast::Type_*> local_70 [2];
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar8;
  
  local_b8 = 0;
  pEVar5 = bindReplCount(comp,(syntax->countExpr).ptr,context,&local_b8);
  bVar3 = Expression::bad(pEVar5);
  if (bVar3) {
    pEVar5 = Expression::badExpr(comp,(Expression *)0x0);
    return pEVar5;
  }
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_d0 = (ReplicatedAssignmentPatternExpression *)type;
  local_c8 = pEVar5;
  sVar12 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  sVar8 = sVar12._M_end.current;
  while (sVar2 = local_b8, src = sVar12._M_end.current, local_b0._0_8_ = sVar12._M_begin.current,
        (Symbol *)local_b0._0_8_ != sVar8.current) {
    local_e0._M_ptr = (pointer)DeclaredType::getType((DeclaredType *)(local_b0._0_8_ + 0x40));
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
              ((SmallVectorBase<slang::ast::Type_const*> *)local_70,(Type **)&local_e0);
    Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment
              ((specific_symbol_iterator<slang::ast::FieldSymbol> *)local_b0);
    sVar12._M_end.current = extraout_RDX.current;
    sVar12._M_begin.current = (Symbol *)local_b0._0_8_;
  }
  uVar11 = (syntax->items).elements._M_extent._M_extent_value + 1 >> 1;
  if (local_70[0].len == uVar11 * local_b8) {
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    lVar10 = 0;
    bVar9 = 0;
    local_e0._M_ptr = (pointer)&syntax->items;
    for (local_e0._M_extent._M_extent_value = 0;
        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_e0._M_ptr != &syntax->items
        || (local_e0._M_extent._M_extent_value != uVar11));
        local_e0._M_extent._M_extent_value = local_e0._M_extent._M_extent_value + 1) {
      lhs = (Type *)slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                    iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference
                              ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&local_e0);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = context;
      pEVar5 = Expression::bindRValue
                         (*(Expression **)((long)local_70[0].data_ + lVar10),lhs,
                          (ExpressionSyntax *)0x0,(SourceRange)(auVar1 << 0x40),(ASTContext *)0x0,
                          (bitmask<slang::ast::ASTFlags>)comp);
      local_c0 = pEVar5;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,&local_c0);
      bVar3 = Expression::bad(pEVar5);
      bVar9 = bVar9 | bVar3;
      lVar10 = lVar10 + 8;
      src.current = extraout_RDX_00;
    }
    compilation = comp;
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)src.current);
    local_e0._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    ctx = local_d0;
    expr = BumpAllocator::
           emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&comp->super_BumpAllocator,(Type *)local_d0,local_c8,&local_e0,&sourceRange);
    pRVar7 = expr;
    if (bVar9 != 0) {
      pRVar7 = (ReplicatedAssignmentPatternExpression *)
               Expression::badExpr(compilation,(Expression *)expr);
      ctx = expr;
    }
    SmallVectorBase<const_slang::ast::Expression_*>::cleanup
              ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,(EVP_PKEY_CTX *)ctx);
  }
  else {
    pDVar6 = ASTContext::addDiag(context,(DiagCode)0xae0007,sourceRange);
    pDVar6 = ast::operator<<(pDVar6,(Type *)local_d0);
    pDVar6 = Diagnostic::operator<<<unsigned_long>(pDVar6,local_70[0].len);
    Diagnostic::operator<<<unsigned_long>
              (pDVar6,((syntax->items).elements._M_extent._M_extent_value + 1 >> 1) * sVar2);
    ctx = (ReplicatedAssignmentPatternExpression *)0x0;
    pRVar7 = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)0x0);
  }
  SmallVectorBase<const_slang::ast::Type_*>::cleanup(local_70,(EVP_PKEY_CTX *)ctx);
  return (Expression *)pRVar7;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindRValue(*types[index++], *item, {}, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}